

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_var_tests.cpp
# Opt level: O3

void __thiscall iu_FlagTest_x_iutest_x_Check_Test::Body(iu_FlagTest_x_iutest_x_Check_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  byte bVar3;
  uint uVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  int *in_R9;
  RepeatCountSet *actual;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffdd8;
  AssertionResult local_220;
  AssertionHelper local_1f8;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  local_1a8._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,int_volatile>
            (&local_220,(internal *)0x1225b7,"g_result.setup_environment",local_1a8,
             &g_result.setup_environment,in_R9);
  if (local_220.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char (*) [2])0x124357)
    ;
    local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = lasterror;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_1f8);
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char (*) [3])0x122646)
    ;
    local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = strerror(lasterror);
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1c8);
    local_1f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
    ;
    local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x44;
    local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  paVar1 = &local_220.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_message._M_dataplus._M_p,
                    CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                             local_220.m_message.field_2._M_local_buf[0]) + 1);
  }
  if (local_220.m_result != false) {
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_result = (bool)((byte)pTVar5->m_test_flags >> 1 & 1);
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(also_run_disabled_tests)","false","true",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x45;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_result = (bool)((byte)pTVar5->m_test_flags >> 4 & 1);
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(break_on_failure)","false","true",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x46;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_result = (bool)((byte)pTVar5->m_test_flags >> 6 & 1);
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(throw_on_failure)","false","true",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x47;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_result = (bool)((byte)pTVar5->m_test_flags & 1);
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(shuffle)","false","true",(char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x48;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_result = (pTVar5->m_test_flags & 0x30000U) == 0;
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!local_220.m_result) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(catch_exceptions)","true","false",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x49;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    local_220.m_result = ((uint)pTVar5->m_test_flags >> 0xc & 1) == 0;
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!local_220.m_result) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(print_time)","true","false",(char *)in_R9
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x4a;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pVVar6 = iutest::TestEnv::get_vars();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(pVVar6->m_default_package_name)._M_dataplus._M_p,
               (allocator<char> *)&local_1f8);
    actual = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_220,(internal *)"\"env_var\"",
               "::iutest::TestEnv::default_package_name().c_str()","env_var",
               (char *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdd8);
    puVar2 = local_1a8 + 0x10;
    if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != puVar2) {
      operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
    }
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1c8);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x4c;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                               local_220.m_message.field_2._M_local_buf[0]) + 1);
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    uVar4 = (uint)pTVar5->m_test_flags >> 0xd;
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_result = (bool)((byte)uVar4 & 1);
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if ((uVar4 & 1) == 0) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(file_location_style_msvc)","false","true"
                 ,(char *)actual);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x4d;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    bVar3 = (byte)pTVar5->m_test_flags;
    local_220.m_result = (bool)(bVar3 >> 7);
    local_220.m_message._M_string_length = 0;
    local_220.m_message.field_2._M_local_buf[0] = '\0';
    local_220.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (-1 < (char)bVar3) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1c8,(internal *)&local_220,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(warning_into_error)","false","true",
                 (char *)actual);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_1c8._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffddf);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x4e;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_220.m_message.field_2._M_local_buf[0]) + 1);
      }
    }
    local_1a8._0_4_ = 200;
    iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
              (&local_220,(internal *)"200u","::iutest::TestEnv::random_seed()",local_1a8,
               (uint *)&local_1f8,(RandomSeedSet *)actual);
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1c8);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x51;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                               local_220.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_1a8._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
              (&local_220,(internal *)0x1221b9,"::iutest::TestEnv::repeat()",local_1a8,
               (int *)&local_1f8,actual);
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1c8);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x52;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                               local_220.m_message.field_2._M_local_buf[0]) + 1);
    }
    pVVar6 = iutest::TestEnv::get_vars();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(pVVar6->m_test_filter)._M_dataplus._M_p,
               (allocator<char> *)&local_1f8);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_220,(internal *)"\"Flag*\"","::iutest::TestEnv::filter().c_str()","Flag*",
               (char *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdd8);
    if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != puVar2) {
      operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
    }
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1c8);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x54;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                               local_220.m_message.field_2._M_local_buf[0]) + 1);
    }
    pVVar6 = iutest::TestEnv::get_vars();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(pVVar6->m_output_option).m_value._M_dataplus._M_p,
               (allocator<char> *)&local_1f8);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_220,(internal *)"\"test\"","::iutest::TestEnv::output().c_str()","test",
               (char *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdd8);
    if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != puVar2) {
      operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
    }
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_220.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_1c8);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x55;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      CONCAT71(local_220.m_message.field_2._M_allocated_capacity._1_7_,
                               local_220.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

IUTEST(FlagTest, Check)
{
    IUTEST_ASSUME_EQ(0, g_result.setup_environment) << "\n" << lasterror << ": " << strerror(lasterror);  // putenv に失敗した場合はテストしない
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(also_run_disabled_tests) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(break_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(throw_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(shuffle) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(catch_exceptions) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(print_time) );
#if !defined(IUTEST_USE_GTEST)
    IUTEST_EXPECT_STREQ( "env_var", ::iutest::IUTEST_FLAG(default_package_name).c_str() );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(file_location_style_msvc) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(warning_into_error) );
#endif

    IUTEST_EXPECT_EQ( 200u, ::iutest::IUTEST_FLAG(random_seed) );
    IUTEST_EXPECT_EQ(   2 , ::iutest::IUTEST_FLAG(repeat) );

    IUTEST_EXPECT_STREQ( "Flag*", ::iutest::IUTEST_FLAG(filter).c_str() );
    IUTEST_EXPECT_STREQ( "test", ::iutest::IUTEST_FLAG(output).c_str() );
}